

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
     Combine<duckdb::ArgMinMaxState<duckdb::string_t,long>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (ArgMinMaxState<duckdb::string_t,_long> *source,
               ArgMinMaxState<duckdb::string_t,_long> *target,AggregateInputData *param_3)

{
  bool bVar1;
  byte *in_RSI;
  byte *in_RDI;
  
  if (((*in_RDI & 1) != 0) &&
     (((*in_RSI & 1) == 0 ||
      (bVar1 = GreaterThan::Operation<long>((long *)(in_RDI + 0x18),(long *)(in_RSI + 0x18)), bVar1)
      ))) {
    Assign<duckdb::string_t,long,duckdb::ArgMinMaxState<duckdb::string_t,long>>
              (source,(string_t *)target,(long *)param_3,SUB81((ulong)in_RDI >> 0x38,0));
    *in_RSI = 1;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}